

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contour.cpp
# Opt level: O1

void __thiscall PathBuilder::add(PathBuilder *this,Point a,Point b)

{
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *pmVar1;
  _Rb_tree_header *p_Var2;
  iterator *piVar3;
  _Elt_pointer *ppPVar4;
  int iVar5;
  int iVar6;
  mapped_type mVar7;
  pointer pdVar8;
  _Elt_pointer pPVar9;
  pointer pdVar10;
  Point *pPVar11;
  Point PVar12;
  PathBuilder *pPVar13;
  iterator iVar14;
  mapped_type *pmVar15;
  ostream *poVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  key_type *__k;
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *pmVar19;
  deque<Point,std::allocator<Point>> *pdVar20;
  _Base_ptr p_Var21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  pair<std::_Rb_tree_iterator<std::pair<const_Point,_int>_>,_std::_Rb_tree_iterator<std::pair<const_Point,_int>_>_>
  pVar26;
  Point local_1c0;
  Point local_1b8;
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *local_1b0;
  PathBuilder *local_1a8;
  _Base_ptr local_1a0;
  _Base_ptr local_198;
  int local_18c;
  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_> *local_188;
  _Base_ptr local_180;
  _Base_ptr local_178;
  iterator local_170;
  _Deque_iterator<Point,_Point_&,_Point_*> local_150;
  _Deque_iterator<Point,_Point_&,_Point_*> local_130;
  const_iterator local_110;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_f0;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_d0;
  const_iterator local_b0;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_90;
  reverse_iterator<std::_Deque_iterator<Point,_Point_&,_Point_*>_> local_70;
  const_iterator local_50;
  
  pmVar1 = &this->backs;
  local_1c0 = a;
  local_1b8 = b;
  local_1a0 = (_Base_ptr)
              std::
              _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::find(&pmVar1->_M_t,&local_1c0);
  p_Var2 = &(this->backs)._M_t._M_impl.super__Rb_tree_header;
  iVar14 = std::
           _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
           ::find(&pmVar1->_M_t,&local_1b8);
  bVar22 = (_Rb_tree_header *)iVar14._M_node != p_Var2;
  pmVar19 = &this->fronts;
  local_198 = &p_Var2->_M_header;
  iVar14 = std::
           _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
           ::find(&pmVar19->_M_t,&local_1c0);
  p_Var17 = &(this->fronts)._M_t._M_impl.super__Rb_tree_header._M_header;
  bVar23 = iVar14._M_node != p_Var17;
  local_1a8 = this;
  iVar14 = std::
           _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
           ::find(&pmVar19->_M_t,&local_1b8);
  PVar12 = local_1c0;
  p_Var21 = local_198;
  local_1b0 = pmVar19;
  local_188 = pmVar1;
  if (bVar22 || bVar23) {
    local_1c0 = local_1b8;
    local_1b8 = PVar12;
    local_1a0 = (_Base_ptr)
                std::
                _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                ::find(&pmVar1->_M_t,&local_1c0);
    iVar14 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(&pmVar1->_M_t,&local_1b8);
    p_Var21 = local_198;
    bVar22 = iVar14._M_node != local_198;
    iVar14 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(&pmVar19->_M_t,&local_1c0);
    bVar23 = iVar14._M_node != p_Var17;
    iVar14 = std::
             _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
             ::find(&pmVar19->_M_t,&local_1b8);
  }
  pmVar1 = local_188;
  pPVar13 = local_1a8;
  if (ABS(local_1c0.x - local_1b8.x) < 1e-08) {
    if (ABS(local_1c0.y - local_1b8.y) < 1e-08) {
      return;
    }
  }
  if ((local_1a0 == p_Var21 && iVar14._M_node == p_Var17) && !bVar23) {
    std::
    vector<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
    ::emplace_back<>(&local_1a8->paths);
    pmVar1 = local_188;
    pdVar8 = (pPVar13->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pPVar11 = pdVar8[-1].super__Deque_base<Point,_std::allocator<Point>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (pPVar11 ==
        pdVar8[-1].super__Deque_base<Point,_std::allocator<Point>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_last + -1) {
      std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                ((deque<Point,std::allocator<Point>> *)(pdVar8 + -1),&local_1c0);
    }
    else {
      *pPVar11 = local_1c0;
      piVar3 = &pdVar8[-1].super__Deque_base<Point,_std::allocator<Point>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar3->_M_cur = piVar3->_M_cur + 1;
    }
    pmVar19 = local_1b0;
    pdVar8 = (pPVar13->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pPVar11 = pdVar8[-1].super__Deque_base<Point,_std::allocator<Point>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (pPVar11 ==
        pdVar8[-1].super__Deque_base<Point,_std::allocator<Point>_>._M_impl.super__Deque_impl_data.
        _M_finish._M_last + -1) {
      std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                ((deque<Point,std::allocator<Point>> *)(pdVar8 + -1),&local_1b8);
    }
    else {
      *pPVar11 = local_1b8;
      piVar3 = &pdVar8[-1].super__Deque_base<Point,_std::allocator<Point>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar3->_M_cur = piVar3->_M_cur + 1;
    }
    pdVar8 = (pPVar13->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar10 = (pPVar13->paths).
              super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pmVar15 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](pmVar19,&local_1c0);
    *pmVar15 = (int)((ulong)((long)pdVar8 - (long)pdVar10) >> 4) * -0x33333333 + -1;
    pdVar8 = (pPVar13->paths).
             super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pdVar10 = (pPVar13->paths).
              super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pmVar15 = std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
              ::operator[](pmVar1,&local_1b8);
    *pmVar15 = (int)((ulong)((long)pdVar8 - (long)pdVar10) >> 4) * -0x33333333 + -1;
  }
  else {
    bVar24 = iVar14._M_node != p_Var17;
    bVar25 = local_1a0 == p_Var21;
    if (bVar24 && !bVar25) {
      local_180 = iVar14._M_node;
      local_178 = p_Var17;
      pmVar15 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](local_1b0,&local_1b8);
      local_18c = *pmVar15;
      pmVar15 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](pmVar1,&local_1c0);
      p_Var17 = local_178;
      iVar14._M_node = local_180;
      if ((!bVar23 && !bVar22) && local_18c == *pmVar15) {
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](pmVar1,&local_1c0);
        iVar5 = *pmVar15;
        pdVar8 = (local_1a8->paths).
                 super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar20 = (deque<Point,std::allocator<Point>> *)(pdVar8 + iVar5);
        pPVar11 = ((iterator *)
                  ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                  0x30))->_M_cur;
        if (pPVar11 ==
            *(_Elt_pointer *)
             ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x40)
            + -1) {
          std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                    (pdVar20,&local_1b8);
        }
        else {
          *pPVar11 = local_1b8;
          *(long *)(pdVar20 + 0x30) = *(long *)(pdVar20 + 0x30) + 8;
        }
        pmVar19 = local_1b0;
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar1->_M_t,&local_1c0);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar1->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar19->_M_t,&local_1b8);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar19->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        return;
      }
    }
    pmVar19 = local_1b0;
    if ((iVar14._M_node != p_Var17) || ((bVar23 || bVar25) || !bVar22)) {
      if (((local_1a0 == p_Var21 && bVar24) && bVar23) && !bVar22) {
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](local_1b0,&local_1c0);
        iVar5 = *pmVar15;
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](pmVar19,&local_1b8);
        iVar6 = *pmVar15;
        pdVar8 = (local_1a8->paths).
                 super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        p_Var17 = (_Base_ptr)(pdVar8 + iVar6);
        p_Var18 = (_Base_ptr)
                  ((iterator *)
                  ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                  0x30))->_M_cur;
        if (p_Var18 ==
            *(_Base_ptr *)
             ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38))
        {
          p_Var18 = p_Var17[2]._M_parent[-1]._M_right + 0x10;
        }
        pdVar20 = (deque<Point,std::allocator<Point>> *)(pdVar8 + iVar5);
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar1->_M_t,(key_type *)&p_Var18[-1]._M_right);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar1->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        p_Var18 = p_Var17[1]._M_left;
        if (p_Var18 == p_Var17[1]._M_right) {
          p_Var18 = p_Var17[2]._M_parent[-1]._M_right + 0x10;
        }
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](pmVar19,(key_type *)&p_Var18[-1]._M_right);
        *pmVar15 = iVar5;
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar19->_M_t,&local_1c0);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar19->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar19->_M_t,&local_1b8);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar19->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        local_b0._M_cur = *(_Elt_pointer *)(pdVar20 + 0x10);
        local_b0._M_first = *(_Elt_pointer *)(pdVar20 + 0x18);
        local_b0._M_last = *(_Elt_pointer *)(pdVar20 + 0x20);
        local_b0._M_node = *(_Map_pointer *)(pdVar20 + 0x28);
        local_d0.current._M_cur = (_Elt_pointer)p_Var17[1]._M_left;
        local_d0.current._M_first = (_Elt_pointer)p_Var17[1]._M_right;
        local_d0.current._M_last = *(_Elt_pointer *)(p_Var17 + 2);
        local_d0.current._M_node = (_Map_pointer)p_Var17[2]._M_parent;
        local_f0.current._M_cur = (_Elt_pointer)p_Var17->_M_left;
        local_f0.current._M_first = (_Elt_pointer)p_Var17->_M_right;
        local_f0.current._M_last = *(_Elt_pointer *)(p_Var17 + 1);
        local_f0.current._M_node = (_Map_pointer)p_Var17[1]._M_parent;
        std::deque<Point,std::allocator<Point>>::
        insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
                  (&local_170,pdVar20,&local_b0,&local_d0,&local_f0);
      }
      else {
        if (((!bVar24 || bVar25) || bVar23) || bVar22) {
          if ((local_1a0 == p_Var21 && !bVar22) && (bVar24 && !bVar23)) {
            pmVar15 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[](local_1b0,&local_1b8);
            iVar5 = *pmVar15;
            pdVar8 = (local_1a8->paths).
                     super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar20 = (deque<Point,std::allocator<Point>> *)(pdVar8 + iVar5);
            pPVar9 = ((iterator *)
                     ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl
                     + 0x10))->_M_cur;
            if (pPVar9 == *(_Elt_pointer *)
                           ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>.
                                   _M_impl + 0x18)) {
              std::deque<Point,std::allocator<Point>>::_M_push_front_aux<Point_const&>
                        (pdVar20,&local_1c0);
            }
            else {
              pPVar9[-1] = local_1c0;
              *(long *)(pdVar20 + 0x10) = *(long *)(pdVar20 + 0x10) + -8;
            }
            __k = &local_1b8;
            pmVar15 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[](pmVar19,__k);
            mVar7 = *pmVar15;
            pmVar15 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[](pmVar19,&local_1c0);
            *pmVar15 = mVar7;
          }
          else {
            if ((bVar22 || bVar23) || (iVar14._M_node != p_Var17 || bVar25)) {
              if (bVar23) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"fronts contains a\n",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    fronts[",0xb);
                operator<<((ostream *)&std::cerr,&local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar15 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[](local_1b0,&local_1c0);
                poVar16 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              }
              if (iVar14._M_node != p_Var17) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"fronts contains b\n",0x12);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    fronts[",0xb);
                operator<<((ostream *)&std::cerr,&local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar15 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[](local_1b0,&local_1b8);
                poVar16 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              }
              if (local_1a0 != local_198) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"backs contains a\n",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    backs[",10);
                operator<<((ostream *)&std::cerr,&local_1c0);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar15 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[](pmVar1,&local_1c0);
                poVar16 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              }
              if (bVar22) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"backs contains b\n",0x11);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"    backs[",10);
                operator<<((ostream *)&std::cerr,&local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"] == ",5);
                pmVar15 = std::
                          map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                          ::operator[](pmVar1,&local_1b8);
                poVar16 = (ostream *)std::ostream::operator<<(&std::cerr,*pmVar15);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
              }
              poVar16 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c0.x);
              poVar16 = std::operator<<(poVar16,"\" y1=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c0.y);
              poVar16 = std::operator<<(poVar16,"\" x2=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1b8.x);
              poVar16 = std::operator<<(poVar16,"\" y2=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1b8.y);
              std::operator<<(poVar16,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />");
              poVar16 = std::operator<<((ostream *)&std::cout,"<line x1=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c0.x + -10.0);
              poVar16 = std::operator<<(poVar16,"\" y1=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c0.y + -10.0);
              poVar16 = std::operator<<(poVar16,"\" x2=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c0.x + -20.0);
              poVar16 = std::operator<<(poVar16,"\" y2=\"");
              poVar16 = (ostream *)std::ostream::operator<<(poVar16,local_1c0.y + -20.0);
              std::operator<<(poVar16,"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />");
              exit(0x20);
            }
            pmVar15 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[](pmVar1,&local_1c0);
            iVar5 = *pmVar15;
            pdVar8 = (local_1a8->paths).
                     super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pdVar20 = (deque<Point,std::allocator<Point>> *)(pdVar8 + iVar5);
            pPVar9 = ((iterator *)
                     ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl
                     + 0x30))->_M_cur;
            if (pPVar9 == *(_Elt_pointer *)
                           ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>.
                                   _M_impl + 0x40) + -1) {
              std::deque<Point,std::allocator<Point>>::_M_push_back_aux<Point_const&>
                        (pdVar20,&local_1b8);
            }
            else {
              *pPVar9 = local_1b8;
              *(long *)(pdVar20 + 0x30) = *(long *)(pdVar20 + 0x30) + 8;
            }
            __k = &local_1c0;
            pmVar15 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[](pmVar1,__k);
            mVar7 = *pmVar15;
            pmVar15 = std::
                      map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                      ::operator[](pmVar1,&local_1b8);
            *pmVar15 = mVar7;
            pmVar19 = pmVar1;
          }
          std::map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
          erase(pmVar19,__k);
          return;
        }
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](pmVar1,&local_1c0);
        pmVar19 = local_1b0;
        iVar5 = *pmVar15;
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](local_1b0,&local_1b8);
        iVar6 = *pmVar15;
        pdVar8 = (local_1a8->paths).
                 super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pdVar20 = (deque<Point,std::allocator<Point>> *)(pdVar8 + iVar5);
        p_Var17 = (_Base_ptr)(pdVar8 + iVar6);
        p_Var18 = (_Base_ptr)
                  ((iterator *)
                  ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                  0x30))->_M_cur;
        if (p_Var18 ==
            *(_Base_ptr *)
             ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38))
        {
          p_Var18 = p_Var17[2]._M_parent[-1]._M_right + 0x10;
        }
        pmVar15 = std::
                  map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                  operator[](pmVar1,(key_type *)&p_Var18[-1]._M_right);
        *pmVar15 = iVar5;
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar19->_M_t,&local_1c0);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar19->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        pVar26 = std::
                 _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
                 ::equal_range(&pmVar19->_M_t,&local_1b8);
        std::
        _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
        ::_M_erase_aux(&pmVar19->_M_t,(_Base_ptr)pVar26.first._M_node,
                       (_Base_ptr)pVar26.second._M_node);
        local_110._M_cur = *(_Elt_pointer *)(pdVar20 + 0x30);
        local_110._M_first = *(_Elt_pointer *)(pdVar20 + 0x38);
        local_110._M_last = *(_Elt_pointer *)(pdVar20 + 0x40);
        local_110._M_node = *(_Map_pointer *)(pdVar20 + 0x48);
        local_130._M_cur = (_Elt_pointer)p_Var17->_M_left;
        local_130._M_first = (_Elt_pointer)p_Var17->_M_right;
        local_130._M_last = *(_Elt_pointer *)(p_Var17 + 1);
        local_130._M_node = (_Map_pointer)p_Var17[1]._M_parent;
        local_150._M_cur = (_Elt_pointer)p_Var17[1]._M_left;
        local_150._M_first = (_Elt_pointer)p_Var17[1]._M_right;
        local_150._M_last = *(_Elt_pointer *)(p_Var17 + 2);
        local_150._M_node = (_Map_pointer)p_Var17[2]._M_parent;
        std::deque<Point,std::allocator<Point>>::
        insert<std::_Deque_iterator<Point,Point&,Point*>,void>
                  (&local_170,pdVar20,&local_110,&local_130,&local_150);
      }
      std::deque<Point,_std::allocator<Point>_>::clear
                ((deque<Point,_std::allocator<Point>_> *)p_Var17);
    }
    else {
      pmVar15 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](pmVar1,&local_1c0);
      iVar5 = *pmVar15;
      pmVar15 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](pmVar1,&local_1b8);
      pmVar19 = local_1b0;
      iVar6 = *pmVar15;
      pdVar8 = (local_1a8->paths).
               super__Vector_base<std::deque<Point,_std::allocator<Point>_>,_std::allocator<std::deque<Point,_std::allocator<Point>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_198 = (_Base_ptr)(pdVar8 + iVar5);
      local_1a0 = (_Base_ptr)(pdVar8 + iVar6);
      pVar26 = std::
               _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::equal_range(&local_1b0->_M_t,
                             ((iterator *)
                             ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>.
                                     _M_impl + 0x10))->_M_cur);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::_M_erase_aux(&pmVar19->_M_t,(_Base_ptr)pVar26.first._M_node,(_Base_ptr)pVar26.second._M_node
                    );
      pmVar15 = std::
                map<Point,_int,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>::
                operator[](pmVar1,((iterator *)
                                  ((long)&pdVar8[iVar6].
                                          super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                                  0x10))->_M_cur);
      *pmVar15 = iVar5;
      pVar26 = std::
               _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::equal_range(&pmVar1->_M_t,&local_1c0);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::_M_erase_aux(&pmVar1->_M_t,(_Base_ptr)pVar26.first._M_node,(_Base_ptr)pVar26.second._M_node)
      ;
      pVar26 = std::
               _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
               ::equal_range(&pmVar1->_M_t,&local_1b8);
      std::
      _Rb_tree<Point,_std::pair<const_Point,_int>,_std::_Select1st<std::pair<const_Point,_int>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_int>_>_>
      ::_M_erase_aux(&pmVar1->_M_t,(_Base_ptr)pVar26.first._M_node,(_Base_ptr)pVar26.second._M_node)
      ;
      local_50._M_cur =
           ((iterator *)
           ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x30))->
           _M_cur;
      local_50._M_first =
           *(_Elt_pointer *)
            ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38);
      ppPVar4 = (_Elt_pointer *)
                ((long)&pdVar8[iVar5].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                0x40);
      local_50._M_last = *ppPVar4;
      local_50._M_node = (_Map_pointer)ppPVar4[1];
      local_70.current._M_cur =
           ((iterator *)
           ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x30))->
           _M_cur;
      local_70.current._M_first =
           *(_Elt_pointer *)
            ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x38);
      ppPVar4 = (_Elt_pointer *)
                ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                0x40);
      local_70.current._M_last = *ppPVar4;
      local_70.current._M_node = (_Map_pointer)ppPVar4[1];
      local_90.current._M_cur =
           ((iterator *)
           ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x10))->
           _M_cur;
      local_90.current._M_first =
           *(_Elt_pointer *)
            ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl + 0x18);
      ppPVar4 = (_Elt_pointer *)
                ((long)&pdVar8[iVar6].super__Deque_base<Point,_std::allocator<Point>_>._M_impl +
                0x20);
      local_90.current._M_last = *ppPVar4;
      local_90.current._M_node = (_Map_pointer)ppPVar4[1];
      std::deque<Point,std::allocator<Point>>::
      insert<std::reverse_iterator<std::_Deque_iterator<Point,Point&,Point*>>,void>
                (&local_170,(deque<Point,std::allocator<Point>> *)local_198,&local_50,&local_70,
                 &local_90);
      p_Var17 = local_1a0;
      std::deque<Point,_std::allocator<Point>_>::clear
                ((deque<Point,_std::allocator<Point>_> *)local_1a0);
    }
    std::deque<Point,_std::allocator<Point>_>::_M_shrink_to_fit
              ((deque<Point,_std::allocator<Point>_> *)p_Var17);
  }
  return;
}

Assistant:

void PathBuilder::add(Point a, Point b) {
    using namespace std;
    auto backs_contains_a = backs.find(a) != backs.end();
    auto backs_contains_b = backs.find(b) != backs.end();
    auto fronts_contains_a = fronts.find(a) != fronts.end();
    auto fronts_contains_b = fronts.find(b) != fronts.end();

    if (fronts_contains_a || backs_contains_b) {
        swap(a, b);
        backs_contains_a = backs.find(a) != backs.end();
        backs_contains_b = backs.find(b) != backs.end();
        fronts_contains_a = fronts.find(a) != fronts.end();
        fronts_contains_b = fronts.find(b) != fronts.end();
    }

    if (a == b) {
        return;
    }

    if (!fronts_contains_b && !backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // add a new path
        paths.emplace_back();
        paths.back().push_back(a);
        paths.back().push_back(b);
        fronts[a] = paths.size()-1;
        backs[b] = paths.size()-1;
    } else if (fronts_contains_b && backs_contains_a && (fronts[b] == backs[a]) && !backs_contains_b && !fronts_contains_a) {
        // close a loop
        paths[backs[a]].push_back(b);

        backs.erase(a);
        fronts.erase(b);
    } else if (backs_contains_b && backs_contains_a && !fronts_contains_a && !fronts_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = backs[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        fronts.erase(back_path.front());
        backs[back_path.front()] = front_path_index;
        backs.erase(a);
        backs.erase(b);

        front_path.insert(front_path.end(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && fronts_contains_a && !backs_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = fronts[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs.erase(back_path.back());
        fronts[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.begin(), back_path.rbegin(), back_path.rend());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && backs_contains_a && !fronts_contains_a && !backs_contains_b) {
        // join two paths
        auto front_path_index = backs[a];
        auto back_path_index = fronts[b];
        auto &front_path = paths[front_path_index];
        auto &back_path = paths[back_path_index];

        backs[back_path.back()] = front_path_index;
        fronts.erase(a);
        fronts.erase(b);

        front_path.insert(front_path.end(), back_path.begin(), back_path.end());
        back_path.clear();
        back_path.shrink_to_fit();
    } else if (fronts_contains_b && !fronts_contains_a && !backs_contains_b && !backs_contains_a) {
        // prepend to an existing path
        paths[fronts[b]].push_front(a);
        fronts[a] = fronts[b];
        fronts.erase(b);
    } else if (backs_contains_a && !fronts_contains_b && !fronts_contains_a && !backs_contains_b) {
        // append to an existing path
        paths[backs[a]].push_back(b);
        backs[b] = backs[a];
        backs.erase(a);
    } else {
        if (fronts_contains_a) {
            cerr<<"fronts contains a\n";
            cerr<<"    fronts["<<a<<"] == "<<fronts[a]<<"\n";
        }
        if (fronts_contains_b) {
            cerr<<"fronts contains b\n";
            cerr<<"    fronts["<<b<<"] == "<<fronts[b]<<"\n";
        }
        if (backs_contains_a) {
            cerr<<"backs contains a\n";
            cerr<<"    backs["<<a<<"] == "<<backs[a]<<"\n";
        }
        if (backs_contains_b) {
            cerr<<"backs contains b\n";
            cerr<<"    backs["<<b<<"] == "<<backs[b]<<"\n";
        }
        cout<<"<line x1=\""<<a.x<<"\" y1=\""<<a.y<<"\" x2=\""<<b.x<<"\" y2=\""<<b.y<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.30\" />";
        cout<<"<line x1=\""<<a.x-10<<"\" y1=\""<<a.y-10<<"\" x2=\""<<a.x-20<<"\" y2=\""<<a.y-20<<"\" style=\"stroke:rgb(0,0,255);stroke-width:1.00\" />";
        exit(32);
    }
}